

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void XYcZ_add(tc_uECC_word_t *X1,tc_uECC_word_t *Y1,tc_uECC_word_t *X2,tc_uECC_word_t *Y2,
             tc_uECC_Curve curve)

{
  wordcount_t num_words_00;
  tc_uECC_word_t local_58;
  wordcount_t num_words;
  tc_uECC_word_t t5 [8];
  tc_uECC_Curve curve_local;
  tc_uECC_word_t *Y2_local;
  tc_uECC_word_t *X2_local;
  tc_uECC_word_t *Y1_local;
  tc_uECC_word_t *X1_local;
  
  num_words_00 = curve->num_words;
  tc_uECC_vli_modSub(&local_58,X2,X1,curve->p,num_words_00);
  tc_uECC_vli_modSquare_fast(&local_58,&local_58,curve);
  tc_uECC_vli_modMult_fast(X1,X1,&local_58,curve);
  tc_uECC_vli_modMult_fast(X2,X2,&local_58,curve);
  tc_uECC_vli_modSub(Y2,Y2,Y1,curve->p,num_words_00);
  tc_uECC_vli_modSquare_fast(&local_58,Y2,curve);
  tc_uECC_vli_modSub(&local_58,&local_58,X1,curve->p,num_words_00);
  tc_uECC_vli_modSub(&local_58,&local_58,X2,curve->p,num_words_00);
  tc_uECC_vli_modSub(X2,X2,X1,curve->p,num_words_00);
  tc_uECC_vli_modMult_fast(Y1,Y1,X2,curve);
  tc_uECC_vli_modSub(X2,X1,&local_58,curve->p,num_words_00);
  tc_uECC_vli_modMult_fast(Y2,Y2,X2,curve);
  tc_uECC_vli_modSub(Y2,Y2,Y1,curve->p,num_words_00);
  tc_uECC_vli_set(X2,&local_58,num_words_00);
  return;
}

Assistant:

static void XYcZ_add(uECC_word_t * RESTRICT X1,
                     uECC_word_t * RESTRICT Y1,
                     uECC_word_t * RESTRICT X2,
                     uECC_word_t * RESTRICT Y2) {
    /* t1 = X1, t2 = Y1, t3 = X2, t4 = Y2 */
    uECC_word_t t5[uECC_WORDS];

    vli_modSub_fast(t5, X2, X1);  /* t5 = x2 - x1 */
    vli_modSquare_fast(t5, t5);   /* t5 = (x2 - x1)^2 = A */
    vli_modMult_fast(X1, X1, t5); /* t1 = x1*A = B */
    vli_modMult_fast(X2, X2, t5); /* t3 = x2*A = C */
    vli_modSub_fast(Y2, Y2, Y1);  /* t4 = y2 - y1 */
    vli_modSquare_fast(t5, Y2);   /* t5 = (y2 - y1)^2 = D */

    vli_modSub_fast(t5, t5, X1);  /* t5 = D - B */
    vli_modSub_fast(t5, t5, X2);  /* t5 = D - B - C = x3 */
    vli_modSub_fast(X2, X2, X1);  /* t3 = C - B */
    vli_modMult_fast(Y1, Y1, X2); /* t2 = y1*(C - B) */
    vli_modSub_fast(X2, X1, t5);  /* t3 = B - x3 */
    vli_modMult_fast(Y2, Y2, X2); /* t4 = (y2 - y1)*(B - x3) */
    vli_modSub_fast(Y2, Y2, Y1);  /* t4 = y3 */

    vli_set(X2, t5);
}